

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

bool bssl::anon_unknown_0::MakeECHConfig
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,ECHConfigParams *params)

{
  uint16_t *puVar1;
  uint16_t value;
  int iVar2;
  EVP_HPKE_KEM *kem;
  uint8_t *puVar3;
  uint8_t *puVar4;
  size_t sVar5;
  bool bVar6;
  uint16_t *puVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> public_key;
  ScopedCBB cbb;
  CBB child;
  CBB contents;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  CBB local_c0;
  CBB local_90;
  CBB local_60;
  
  value = params->kem_id;
  if (value == 0) {
    kem = EVP_HPKE_KEY_kem(params->key);
    value = EVP_HPKE_KEM_id(kem);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_d8,&params->public_key);
  if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_d8,0x41);
    iVar2 = EVP_HPKE_KEY_public_key
                      (params->key,
                       local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,(size_t *)&local_c0,
                       (long)local_d8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_d8.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    if (iVar2 == 0) {
      bVar6 = false;
      goto LAB_00166289;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&local_d8,(size_type)local_c0.child);
  }
  CBB_zero(&local_c0);
  iVar2 = CBB_init(&local_c0,0x40);
  if (iVar2 == 0) {
LAB_0016627d:
    bVar6 = false;
  }
  else {
    iVar2 = CBB_add_u16(&local_c0,params->version);
    if (iVar2 == 0) goto LAB_0016627d;
    iVar2 = CBB_add_u16_length_prefixed(&local_c0,&local_60);
    if (iVar2 == 0) goto LAB_0016627d;
    iVar2 = CBB_add_u8(&local_60,(uint8_t)params->config_id);
    if (iVar2 == 0) goto LAB_0016627d;
    iVar2 = CBB_add_u16(&local_60,value);
    if (iVar2 == 0) goto LAB_0016627d;
    iVar2 = CBB_add_u16_length_prefixed(&local_60,&local_90);
    if (iVar2 == 0) goto LAB_0016627d;
    iVar2 = CBB_add_bytes(&local_90,
                          local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_d8.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
    if (iVar2 == 0) goto LAB_0016627d;
    iVar2 = CBB_add_u16_length_prefixed(&local_60,&local_90);
    if (iVar2 == 0) goto LAB_0016627d;
    puVar7 = (params->cipher_suites).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar1 = (params->cipher_suites).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar7 != puVar1) {
      do {
        iVar2 = CBB_add_u16(&local_90,*puVar7);
        if (iVar2 == 0) goto LAB_0016627d;
        puVar7 = puVar7 + 1;
      } while (puVar7 != puVar1);
    }
    iVar2 = CBB_add_u8(&local_60,(uint8_t)params->max_name_len);
    if (iVar2 == 0) goto LAB_0016627d;
    iVar2 = CBB_add_u8_length_prefixed(&local_60,&local_90);
    if (iVar2 == 0) goto LAB_0016627d;
    iVar2 = CBB_add_bytes(&local_90,(uint8_t *)(params->public_name)._M_dataplus._M_p,
                          (params->public_name)._M_string_length);
    if (iVar2 == 0) goto LAB_0016627d;
    iVar2 = CBB_add_u16_length_prefixed(&local_60,&local_90);
    if (iVar2 == 0) goto LAB_0016627d;
    puVar3 = (params->extensions).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar2 = CBB_add_bytes(&local_90,puVar3,
                          (long)(params->extensions).
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar3);
    if (iVar2 == 0) goto LAB_0016627d;
    iVar2 = CBB_flush(&local_c0);
    if (iVar2 == 0) goto LAB_0016627d;
    puVar3 = CBB_data(&local_c0);
    puVar4 = CBB_data(&local_c0);
    sVar5 = CBB_len(&local_c0);
    bVar6 = true;
    std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_assign_aux<unsigned_char_const*>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)out,puVar3,puVar4 + sVar5);
  }
  CBB_cleanup(&local_c0);
LAB_00166289:
  if (local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uint8_t *)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar6;
}

Assistant:

bool MakeECHConfig(std::vector<uint8_t> *out, const ECHConfigParams &params) {
  uint16_t kem_id = params.kem_id == 0
                        ? EVP_HPKE_KEM_id(EVP_HPKE_KEY_kem(params.key))
                        : params.kem_id;
  std::vector<uint8_t> public_key = params.public_key;
  if (public_key.empty()) {
    public_key.resize(EVP_HPKE_MAX_PUBLIC_KEY_LENGTH);
    size_t len;
    if (!EVP_HPKE_KEY_public_key(params.key, public_key.data(), &len,
                                 public_key.size())) {
      return false;
    }
    public_key.resize(len);
  }

  bssl::ScopedCBB cbb;
  CBB contents, child;
  if (!CBB_init(cbb.get(), 64) ||                                      //
      !CBB_add_u16(cbb.get(), params.version) ||                       //
      !CBB_add_u16_length_prefixed(cbb.get(), &contents) ||            //
      !CBB_add_u8(&contents, params.config_id) ||                      //
      !CBB_add_u16(&contents, kem_id) ||                               //
      !CBB_add_u16_length_prefixed(&contents, &child) ||               //
      !CBB_add_bytes(&child, public_key.data(), public_key.size()) ||  //
      !CBB_add_u16_length_prefixed(&contents, &child)) {
    return false;
  }
  for (uint16_t cipher_suite : params.cipher_suites) {
    if (!CBB_add_u16(&child, cipher_suite)) {
      return false;
    }
  }
  if (!CBB_add_u8(&contents, params.max_name_len) ||
      !CBB_add_u8_length_prefixed(&contents, &child) ||
      !CBB_add_bytes(
          &child, reinterpret_cast<const uint8_t *>(params.public_name.data()),
          params.public_name.size()) ||
      !CBB_add_u16_length_prefixed(&contents, &child) ||
      !CBB_add_bytes(&child, params.extensions.data(),
                     params.extensions.size()) ||
      !CBB_flush(cbb.get())) {
    return false;
  }

  out->assign(CBB_data(cbb.get()), CBB_data(cbb.get()) + CBB_len(cbb.get()));
  return true;
}